

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O3

void __thiscall xmrig::OclConfig::generate(OclConfig *this)

{
  int iVar1;
  const_iterator cVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var3;
  size_t sVar4;
  ulong uVar5;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *__range1;
  ulong __n;
  OclDevice *device;
  OclDevice *__args;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> devices;
  OclThreads local_88;
  uint32_t local_6c;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> local_68;
  OclPlatform local_50;
  OclPlatform local_40;
  
  if (this->m_enabled == true) {
    String::String((String *)&local_88,"cn/blur");
    cVar2 = std::
            _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::OclThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::OclThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
            ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::OclThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::OclThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
                    *)&this->m_threads,(key_type *)&local_88);
    if ((OclDevice *)
        local_88.m_data.super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
        _M_impl.super__Vector_impl_data._M_start != (OclDevice *)0x0) {
      operator_delete__(local_88.m_data.
                        super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Rb_tree_header *)cVar2._M_node ==
        &(this->m_threads).m_profiles._M_t._M_impl.super__Rb_tree_header) {
      iVar1 = OclLib::init((EVP_PKEY_CTX *)(this->m_loader).m_data);
      if ((char)iVar1 != '\0') {
        if ((this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_40 = platform(this);
          OclPlatform::devices(&local_68,&local_40);
        }
        else {
          local_50 = platform(this);
          OclPlatform::devices
                    ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)&local_88,
                     &local_50);
          local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar5 = ((long)local_88.m_data.
                         super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.m_data.
                         super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
          __n = (long)(this->m_devicesHint).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_devicesHint).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
          if (uVar5 <= __n) {
            __n = uVar5;
          }
          std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::reserve(&local_68,__n);
          if (local_88.m_data.
              super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_88.m_data.
              super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __args = (OclDevice *)
                     local_88.m_data.
                     super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl
                     .super__Vector_impl_data._M_start;
            do {
              local_6c = __args->m_index;
              _Var3 = std::
                      __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                ((this->m_devicesHint).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (this->m_devicesHint).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_6c);
              if (_Var3._M_current !=
                  (this->m_devicesHint).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>>::
                emplace_back<xmrig::OclDevice_const&>
                          ((vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>> *)&local_68,
                           __args);
              }
              __args = __args + 1;
            } while (__args != (OclDevice *)
                               local_88.m_data.
                               super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector
                    ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)&local_88);
        }
        if (local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl
            .super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          OclThreads::OclThreads(&local_88,&local_68);
          sVar4 = Threads<xmrig::OclThreads>::move(&this->m_threads,"cn/blur",&local_88);
          std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::~vector
                    (&local_88.m_data);
          this->m_shouldSave = sVar4 != 0;
        }
        std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector(&local_68);
      }
    }
  }
  return;
}

Assistant:

void xmrig::OclConfig::generate()
{
    if (!isEnabled() || m_threads.has()) {
        return;
    }

    if (!OclLib::init(loader())) {
        return;
    }

    const auto devices = m_devicesHint.empty() ? platform().devices() : filterDevices(platform().devices(), m_devicesHint);
    if (devices.empty()) {
        return;
    }

    size_t count = 0;

    count += xmrig::generate(m_threads, devices);

    m_shouldSave = count > 0;
}